

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cted_tree_index_impl.h
# Opt level: O1

double __thiscall
ted_ub::CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>::ted
          (CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
           *this,TreeIndexSCTED *t1,TreeIndexSCTED *t2)

{
  size_type columns;
  Matrix<double> *this_00;
  long lVar1;
  longlong *plVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  pointer pdVar7;
  pointer pvVar8;
  pointer pvVar9;
  Matrix<double> *this_01;
  CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED> *pCVar10;
  double *pdVar11;
  pointer piVar12;
  undefined8 *puVar13;
  pointer pdVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  uint uVar18;
  size_t sVar19;
  Matrix<double> *pMVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  vector<double,_std::allocator<double>_> dt2;
  vector<double,_std::allocator<double>_> df2;
  allocator_type local_e9;
  ulong local_e8;
  ulong local_e0;
  Matrix<double> *local_d8;
  CTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED> *local_d0;
  ulong local_c8;
  size_t local_c0;
  Matrix<double> local_b8;
  vector<double,_std::allocator<double>_> local_90;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  (this->super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>).
  subproblem_counter_ = 0;
  uVar18 = (t1->super_Constants).tree_size_;
  local_e8 = (ulong)uVar18;
  local_48 = (size_t)(int)uVar18;
  uVar18 = (t2->super_Constants).tree_size_;
  local_c8 = (ulong)uVar18;
  local_50 = (size_t)(int)uVar18;
  sVar17 = local_48 + 1;
  columns = local_50 + 1;
  data_structures::Matrix<double>::Matrix(&local_b8,sVar17,columns);
  (this->dt_).rows_ = local_b8.rows_;
  (this->dt_).columns_ = local_b8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->dt_).data_,&local_b8.data_);
  if (local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  data_structures::Matrix<double>::Matrix(&local_b8,sVar17,columns);
  (this->df_).rows_ = local_b8.rows_;
  (this->df_).columns_ = local_b8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->df_).data_,&local_b8.data_);
  if (local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  data_structures::Matrix<double>::Matrix(&local_b8,sVar17,columns);
  (this->e_).rows_ = local_b8.rows_;
  (this->e_).columns_ = local_b8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->e_).data_,&local_b8.data_);
  if (local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  pdVar7 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar14 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar14 != pdVar7; pdVar14 = pdVar14 + 1) {
    *pdVar14 = INFINITY;
  }
  pdVar7 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar14 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar14 != pdVar7; pdVar14 = pdVar14 + 1) {
    *pdVar14 = INFINITY;
  }
  pdVar7 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar14 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar14 != pdVar7; pdVar14 = pdVar14 + 1) {
    *pdVar14 = INFINITY;
  }
  local_d0 = this;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_b8,columns,
             (allocator_type *)&local_90);
  std::vector<double,_std::allocator<double>_>::vector(&local_90,columns,&local_e9);
  pCVar10 = local_d0;
  this_00 = &local_d0->dt_;
  pdVar11 = data_structures::Matrix<double>::at(this_00,0,0);
  pMVar20 = &pCVar10->df_;
  *pdVar11 = 0.0;
  pdVar11 = data_structures::Matrix<double>::at(pMVar20,0,0);
  *pdVar11 = 0.0;
  local_d8 = pMVar20;
  if (0 < (int)local_e8) {
    sVar17 = local_e8 + 1;
    sVar19 = 1;
    do {
      pdVar11 = data_structures::Matrix<double>::at(pMVar20,sVar19,0);
      *pdVar11 = 0.0;
      pvVar8 = (t1->super_PostLToChildren).postl_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar12 = *(pointer *)
                 &pvVar8[sVar19 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (*(pointer *)
           ((long)&pvVar8[sVar19 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
          piVar12) {
        uVar18 = 2;
        do {
          pdVar11 = data_structures::Matrix<double>::at(this_00,(long)piVar12[uVar18 - 2] + 1,0);
          dVar23 = *pdVar11;
          pdVar11 = data_structures::Matrix<double>::at(local_d8,sVar19,0);
          *pdVar11 = dVar23 + *pdVar11;
          uVar21 = (ulong)uVar18;
          pvVar8 = (t1->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar12 = *(pointer *)
                     &pvVar8[sVar19 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
          uVar18 = uVar18 + 1;
        } while (uVar21 <= (ulong)((long)*(pointer *)
                                          ((long)&pvVar8[sVar19 - 1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar12 >> 2));
      }
      pMVar20 = local_d8;
      pdVar11 = data_structures::Matrix<double>::at(local_d8,sVar19,0);
      dVar23 = *pdVar11;
      pdVar11 = data_structures::Matrix<double>::at(this_00,sVar19,0);
      *pdVar11 = dVar23 + 1.0;
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar17);
  }
  if (0 < (int)local_c8) {
    sVar17 = local_c8 + 1;
    sVar19 = 1;
    do {
      pdVar11 = data_structures::Matrix<double>::at(pMVar20,0,sVar19);
      *pdVar11 = 0.0;
      pvVar8 = (t2->super_PostLToChildren).postl_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar12 = *(pointer *)
                 &pvVar8[sVar19 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (*(pointer *)
           ((long)&pvVar8[sVar19 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
          piVar12) {
        uVar18 = 2;
        do {
          pdVar11 = data_structures::Matrix<double>::at(this_00,0,(long)piVar12[uVar18 - 2] + 1);
          dVar23 = *pdVar11;
          pdVar11 = data_structures::Matrix<double>::at(local_d8,0,sVar19);
          *pdVar11 = dVar23 + *pdVar11;
          uVar21 = (ulong)uVar18;
          pvVar8 = (t2->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar12 = *(pointer *)
                     &pvVar8[sVar19 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
          uVar18 = uVar18 + 1;
        } while (uVar21 <= (ulong)((long)*(pointer *)
                                          ((long)&pvVar8[sVar19 - 1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar12 >> 2));
      }
      pMVar20 = local_d8;
      pdVar11 = data_structures::Matrix<double>::at(local_d8,0,sVar19);
      dVar23 = *pdVar11;
      pdVar11 = data_structures::Matrix<double>::at(this_00,0,sVar19);
      *pdVar11 = dVar23 + 1.0;
      sVar19 = sVar19 + 1;
    } while (sVar19 != sVar17);
  }
  if (0 < (int)local_e8) {
    pMVar20 = &local_d0->e_;
    local_40 = (ulong)((int)local_c8 + 1);
    local_e8 = (ulong)((int)local_e8 + 1);
    uVar21 = 1;
    puVar13 = (undefined8 *)local_b8.rows_;
    do {
      for (; pdVar14 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start, puVar13 != (undefined8 *)local_b8.columns_;
          puVar13 = puVar13 + 1) {
        *puVar13 = 0x7ff0000000000000;
      }
      for (; pdVar14 !=
             local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish; pdVar14 = pdVar14 + 1) {
        *pdVar14 = INFINITY;
      }
      if (0 < (int)local_c8) {
        lVar1 = uVar21 - 1;
        uVar16 = 1;
        local_38 = uVar21;
        do {
          pdVar11 = data_structures::Matrix<double>::at(pMVar20,0,0);
          *pdVar11 = 0.0;
          pvVar8 = (t1->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_e0 = uVar16;
          if (*(pointer *)
               ((long)&pvVar8[lVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
              *(pointer *)&pvVar8[lVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
            sVar17 = 1;
            uVar18 = 2;
            do {
              pdVar11 = data_structures::Matrix<double>::at(pMVar20,(ulong)(uVar18 - 2),0);
              dVar23 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at
                                  (this_00,(long)*(int *)(*(long *)&(t1->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar18 - 2) * 4) + 1,0);
              dVar3 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at(pMVar20,sVar17,0);
              *pdVar11 = dVar23 + dVar3;
              pvVar8 = (t1->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              sVar17 = (size_t)uVar18;
              uVar18 = uVar18 + 1;
            } while (sVar17 <= (ulong)((long)*(pointer *)
                                              ((long)&pvVar8[lVar1].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl + 8) -
                                       *(long *)&pvVar8[lVar1].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl >> 2));
          }
          lVar15 = local_e0 - 1;
          pvVar8 = (t2->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pvVar8[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
              *(pointer *)&pvVar8[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
            sVar17 = 1;
            uVar18 = 2;
            do {
              pdVar11 = data_structures::Matrix<double>::at(pMVar20,0,(ulong)(uVar18 - 2));
              dVar23 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at
                                  (this_00,0,
                                   (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                            postl_to_children_.
                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar15].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar18 - 2) * 4) + 1);
              dVar3 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at(pMVar20,0,sVar17);
              *pdVar11 = dVar23 + dVar3;
              pvVar8 = (t2->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              sVar17 = (size_t)uVar18;
              uVar18 = uVar18 + 1;
            } while (sVar17 <= (ulong)((long)*(pointer *)
                                              ((long)&pvVar8[lVar15].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl + 8) -
                                       *(long *)&pvVar8[lVar15].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl >> 2));
          }
          pvVar8 = (t1->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pvVar8[lVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
              *(pointer *)&pvVar8[lVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
            local_c0 = 1;
            do {
              sVar17 = local_c0;
              pvVar8 = (t2->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (*(pointer *)
                   ((long)&pvVar8[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                  != *(pointer *)
                      &pvVar8[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
                uVar21 = (ulong)((int)local_c0 - 1);
                sVar19 = 1;
                uVar18 = 2;
                do {
                  plVar2 = &(local_d0->
                            super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexSCTED>
                            ).subproblem_counter_;
                  *plVar2 = *plVar2 + 1;
                  uVar16 = (ulong)(uVar18 - 2);
                  pdVar11 = data_structures::Matrix<double>::at(pMVar20,sVar17,uVar16);
                  dVar23 = *pdVar11;
                  pdVar11 = data_structures::Matrix<double>::at
                                      (this_00,0,
                                       (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                postl_to_children_.
                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar15].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4) + 1);
                  dVar3 = *pdVar11;
                  pdVar11 = data_structures::Matrix<double>::at(pMVar20,uVar21,sVar19);
                  dVar4 = *pdVar11;
                  pdVar11 = data_structures::Matrix<double>::at
                                      (this_00,(long)*(int *)(*(long *)&(t1->super_PostLToChildren).
                                                                        postl_to_children_.
                                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar21 * 4) + 1,0);
                  dVar24 = *pdVar11;
                  pdVar11 = data_structures::Matrix<double>::at(pMVar20,uVar21,uVar16);
                  local_68 = *pdVar11;
                  uStack_60 = 0;
                  pdVar11 = data_structures::Matrix<double>::at
                                      (this_00,(long)*(int *)(*(long *)&(t1->super_PostLToChildren).
                                                                        postl_to_children_.
                                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar21 * 4) + 1,
                                       (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                postl_to_children_.
                                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar15].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4) + 1);
                  local_78 = *pdVar11;
                  pdVar11 = data_structures::Matrix<double>::at(pMVar20,sVar17,sVar19);
                  uVar16 = -(ulong)(dVar4 + dVar24 <= dVar23 + dVar3);
                  dVar23 = (double)(~uVar16 & (ulong)(dVar23 + dVar3) |
                                   (ulong)(dVar4 + dVar24) & uVar16);
                  uVar16 = -(ulong)(local_68 + local_78 <= dVar23);
                  *pdVar11 = (double)(uVar16 & (ulong)(local_68 + local_78) |
                                     ~uVar16 & (ulong)dVar23);
                  pvVar8 = (t2->super_PostLToChildren).postl_to_children_.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  sVar19 = (size_t)uVar18;
                  uVar18 = uVar18 + 1;
                } while (sVar19 <= (ulong)((long)*(pointer *)
                                                  ((long)&pvVar8[lVar15].
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) -
                                           *(long *)&pvVar8[lVar15].
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl >> 2));
              }
              pvVar8 = (t1->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_c0 = (size_t)((int)local_c0 + 1);
            } while (local_c0 <=
                     (ulong)((long)*(pointer *)
                                    ((long)&pvVar8[lVar1].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                    8) -
                             *(long *)&pvVar8[lVar1].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl >> 2));
          }
          this_01 = local_d8;
          uVar16 = local_e0;
          pdVar11 = data_structures::Matrix<double>::at(local_d8,0,local_e0);
          uVar21 = local_38;
          dVar23 = *pdVar11;
          dVar3 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar16];
          pdVar11 = data_structures::Matrix<double>::at(this_01,local_38,0);
          dVar4 = *pdVar11;
          pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,uVar16);
          local_68 = *pdVar11;
          pvVar8 = (t1->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar9 = (t2->super_PostLToChildren).postl_to_children_.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = data_structures::Matrix<double>::at
                              (pMVar20,(long)*(pointer *)
                                              ((long)&pvVar8[lVar1].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl + 8) -
                                       *(long *)&pvVar8[lVar1].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl >> 2,
                               (long)*(pointer *)
                                      ((long)&pvVar9[lVar15].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      + 8) -
                               *(long *)&pvVar9[lVar15].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2)
          ;
          local_78 = *pdVar11;
          uStack_70 = 0;
          pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,uVar16);
          uVar22 = -(ulong)(dVar4 + local_68 <= dVar23 + dVar3);
          dVar23 = (double)(~uVar22 & (ulong)(dVar23 + dVar3) | (ulong)(dVar4 + local_68) & uVar22);
          uVar22 = -(ulong)(local_78 <= dVar23);
          *pdVar11 = (double)(uVar22 & (ulong)local_78 | ~uVar22 & (ulong)dVar23);
          pdVar11 = data_structures::Matrix<double>::at(this_00,0,uVar16);
          dVar23 = *pdVar11;
          dVar3 = *(double *)(local_b8.rows_ + uVar16 * 8);
          pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,0);
          dVar4 = *pdVar11;
          pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,uVar16);
          local_68 = *pdVar11;
          pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,uVar16);
          local_78 = *pdVar11;
          uStack_70 = 0;
          iVar5 = (t1->super_PostLToLabelId).postl_to_label_id_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[uVar21 - 1];
          iVar6 = (t2->super_PostLToLabelId).postl_to_label_id_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[uVar16 - 1];
          pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,uVar16);
          uVar16 = local_e0;
          dVar24 = 0.0;
          if (iVar5 != iVar6) {
            dVar24 = 1.0;
          }
          uVar22 = -(ulong)(dVar4 + local_68 <= dVar23 + dVar3);
          dVar23 = (double)(~uVar22 & (ulong)(dVar23 + dVar3) | (ulong)(dVar4 + local_68) & uVar22);
          uVar22 = -(ulong)(local_78 + dVar24 <= dVar23);
          *pdVar11 = (double)(uVar22 & (ulong)(local_78 + dVar24) | ~uVar22 & (ulong)dVar23);
          if (-1 < (t2->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_e0 - 1]) {
            pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,local_e0);
            dVar23 = *pdVar11;
            pdVar11 = data_structures::Matrix<double>::at(this_01,0,uVar16);
            if (dVar23 - *pdVar11 <
                local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)(t2->super_PostLToParent).postl_to_parent_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[uVar16 - 1] + 1]) {
              pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,uVar16);
              dVar23 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at(this_01,0,uVar16);
              local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)(t2->super_PostLToParent).postl_to_parent_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar16 - 1] + 1] = dVar23 - *pdVar11;
            }
            pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,uVar16);
            dVar23 = *pdVar11;
            pdVar11 = data_structures::Matrix<double>::at(this_00,0,uVar16);
            if (dVar23 - *pdVar11 <
                *(double *)
                 (local_b8.rows_ +
                 ((long)(t2->super_PostLToParent).postl_to_parent_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16 - 1] + 1) * 8)) {
              pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,uVar16);
              dVar23 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at(this_00,0,uVar16);
              *(double *)
               (local_b8.rows_ +
               ((long)(t2->super_PostLToParent).postl_to_parent_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[uVar16 - 1] + 1) * 8) = dVar23 - *pdVar11;
            }
          }
          if (-1 < (t1->super_PostLToParent).postl_to_parent_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar21 - 1]) {
            pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,uVar16);
            dVar23 = *pdVar11;
            pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,0);
            dVar3 = *pdVar11;
            pdVar11 = data_structures::Matrix<double>::at
                                (this_01,(long)(t1->super_PostLToParent).postl_to_parent_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[uVar21 - 1] + 1,
                                 uVar16);
            uVar16 = local_e0;
            if (dVar23 - dVar3 < *pdVar11) {
              pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,local_e0);
              dVar23 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at(this_01,uVar21,0);
              dVar3 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at
                                  (this_01,(long)(t1->super_PostLToParent).postl_to_parent_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start
                                                 [uVar21 - 1] + 1,uVar16);
              *pdVar11 = dVar23 - dVar3;
            }
            uVar16 = local_e0;
            pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,local_e0);
            dVar23 = *pdVar11;
            pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,0);
            dVar3 = *pdVar11;
            pdVar11 = data_structures::Matrix<double>::at
                                (this_00,(long)(t1->super_PostLToParent).postl_to_parent_.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[uVar21 - 1] + 1,
                                 uVar16);
            if (dVar23 - dVar3 < *pdVar11) {
              pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,uVar16);
              dVar23 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at(this_00,uVar21,0);
              dVar3 = *pdVar11;
              pdVar11 = data_structures::Matrix<double>::at
                                  (this_00,(long)(t1->super_PostLToParent).postl_to_parent_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start
                                                 [uVar21 - 1] + 1,uVar16);
              *pdVar11 = dVar23 - dVar3;
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_40);
      }
      uVar21 = uVar21 + 1;
      puVar13 = (undefined8 *)local_b8.rows_;
    } while (uVar21 != local_e8);
  }
  pdVar11 = data_structures::Matrix<double>::at(this_00,local_48,local_50);
  dVar23 = *pdVar11;
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((undefined8 *)local_b8.rows_ != (undefined8 *)0x0) {
    operator_delete((void *)local_b8.rows_,
                    (long)local_b8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start - local_b8.rows_);
  }
  return dVar23;
}

Assistant:

double CTEDTreeIndex<CostModel, TreeIndex>::ted(const TreeIndex& t1, const TreeIndex& t2) {

  // Reset subproblem counter.
  subproblem_counter_ = 0;
  
  int t1_input_size = t1.tree_size_;
  int t2_input_size = t2.tree_size_;
  
  // Initialise distance matrices.
  
  // TODO: Verify if a move assignment operator is used here.
  dt_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  df_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  e_ = data_structures::Matrix<double>(t1_input_size+1, t2_input_size+1);
  
  // Fill the matrices with inf.
  dt_.fill_with(std::numeric_limits<double>::infinity());
  df_.fill_with(std::numeric_limits<double>::infinity());
  e_.fill_with(std::numeric_limits<double>::infinity());
  
  std::vector<double> dt2(t2_input_size + 1);
  std::vector<double> df2(t2_input_size + 1);
  
  double a = -1;
  double b = -1;
  double c = -1;
  
  dt_.at(0, 0) = 0;
  df_.at(0, 0) = 0;
  for (int i = 1; i <= t1_input_size; ++i) {
    df_.at(i, 0) = 0;
    for (unsigned int k = 1; k <= t1.postl_to_children_[i-1].size(); ++k) {
      df_.at(i, 0) += dt_.at(t1.postl_to_children_[i-1][k-1] + 1, 0);
    }
    dt_.at(i, 0) = df_.at(i, 0) + c_.del(t1.postl_to_label_id_[i - 1]);
  }
  for (int j = 1; j <= t2_input_size; ++j) {
    df_.at(0, j) = 0;
    for (unsigned int k = 1; k <= t2.postl_to_children_[j-1].size(); ++k) {
      df_.at(0, j) += dt_.at(0, t2.postl_to_children_[j-1][k-1] + 1);
    }
    dt_.at(0, j) = df_.at(0, j) + c_.ins(t2.postl_to_label_id_[j - 1]);
  }
  
  for (int i = 1; i <= t1_input_size; ++i) {
    std::fill(dt2.begin(), dt2.end(), std::numeric_limits<double>::infinity());
    std::fill(df2.begin(), df2.end(), std::numeric_limits<double>::infinity());
    
    for (int j = 1; j <= t2_input_size; ++j) {
      e_.at(0, 0) = 0;
      for (unsigned int s = 1; s <= t1.postl_to_children_[i-1].size(); ++s) {
        e_.at(s, 0) = e_.at(s-1, 0) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, 0); // here we access d for subtree rooted in the s'th child of node i AND s starts with 1 but the postorder of the first child of node i is children1[i][s-1]
      }
      for (unsigned int t = 1; t <= t2.postl_to_children_[j-1].size(); ++t) {
        e_.at(0, t) = e_.at(0, t-1) + dt_.at(0, t2.postl_to_children_[j-1][t-1] + 1);
      }
      
      // TODO: but we already went over each pair of children
      for (unsigned int s = 1; s <= t1.postl_to_children_[i-1].size(); ++s) {
        for (unsigned int t = 1; t <= t2.postl_to_children_[j-1].size(); ++t) {
          ++subproblem_counter_;
          a = e_.at(s, t-1) + dt_.at(0, t2.postl_to_children_[j-1][t-1] + 1);
          b = e_.at(s-1, t) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, 0);
          c = e_.at(s-1, t-1) + dt_.at(t1.postl_to_children_[i-1][s-1] + 1, t2.postl_to_children_[j-1][t-1] + 1); // TODO: This is a problematic part to reduce the memory. This requires to store distance for each pair of children of i and j.
          e_.at(s, t) = a >= b ? b >= c ? c : b : a >= c ? c : a;
        }
      }
      
      a = df_.at(0, j) + df2[j];
      b = df_.at(i, 0) + df_.at(i, j);
      c = e_.at(t1.postl_to_children_[i-1].size(), t2.postl_to_children_[j-1].size());
      
      df_.at(i, j) = a >= b ? b >= c ? c : b : a >= c ? c : a;
      
      a = dt_.at(0, j) + dt2[j];
      b = dt_.at(i, 0) + dt_.at(i, j);
      c = df_.at(i, j) + c_.ren(t1.postl_to_label_id_[i - 1], t2.postl_to_label_id_[j - 1]);
      
      dt_.at(i, j) = a >= b ? b >= c ? c : b : a >= c ? c : a;
      
      if (t2.postl_to_parent_[j-1] > -1) {
        if (df_.at(i, j) - df_.at(0, j) < df2[t2.postl_to_parent_[j-1]+1]) {
          df2[t2.postl_to_parent_[j-1]+1] = df_.at(i, j) - df_.at(0, j);
        }
        if (dt_.at(i, j) - dt_.at(0, j) < dt2[t2.postl_to_parent_[j-1]+1]) {
          dt2[t2.postl_to_parent_[j-1]+1] = dt_.at(i, j) - dt_.at(0, j);
        }
      }
      if (t1.postl_to_parent_[i-1] > -1) {
        if (df_.at(i, j) - df_.at(i, 0) < df_.at(t1.postl_to_parent_[i-1]+1, j)) {
          df_.at(t1.postl_to_parent_[i-1]+1, j) = df_.at(i, j) - df_.at(i, 0);
        }
        if (dt_.at(i, j) - dt_.at(i, 0) < dt_.at(t1.postl_to_parent_[i-1]+1, j)) {
          dt_.at(t1.postl_to_parent_[i-1]+1, j) = dt_.at(i, j) - dt_.at(i, 0);
        }
      }
    }
  }

  return dt_.at(t1_input_size, t2_input_size);
}